

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,_int,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this,
          ParamIteratorInterface<std::tuple<BLOCK_SIZE,_int,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
          *other)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  long *in_RSI;
  long *in_RDI;
  bool dummy [4];
  bool same;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *typed_other;
  GTestLog *in_stack_ffffffffffffff40;
  undefined1 *puVar5;
  bool local_b1;
  ParamIterator<BLOCK_SIZE> *in_stack_ffffffffffffff58;
  ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
  *other_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar6;
  ParamIteratorInterface<std::tuple<BLOCK_SIZE,_int,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  *in_stack_ffffffffffffff70;
  bool local_81;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa8;
  int line;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar7;
  GTestLog local_1c;
  long *local_18;
  bool local_1;
  
  line = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_18 = in_RSI;
  lVar2 = (**(code **)(*in_RDI + 0x10))();
  lVar3 = (**(code **)(*local_18 + 0x10))();
  bVar1 = IsTrue(lVar2 == lVar3);
  if (!bVar1) {
    GTestLog::GTestLog((GTestLog *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (GTestLogSeverity)((ulong)lVar2 >> 0x20),(char *)in_RDI,line);
    poVar4 = GTestLog::GetStream(&local_1c);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    in_stack_ffffffffffffff90 =
         (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *)
         std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(in_stack_ffffffffffffff90,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(in_stack_ffffffffffffff40);
  }
  CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<BLOCK_SIZE,int,void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long),void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>const,testing::internal::ParamIteratorInterface<std::tuple<BLOCK_SIZE,int,void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long),void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>const>
            (in_stack_ffffffffffffff70);
  bVar1 = AtEnd(in_stack_ffffffffffffff90);
  if ((bVar1) && (bVar1 = AtEnd(in_stack_ffffffffffffff90), bVar1)) {
    local_1 = true;
  }
  else {
    std::
    get<0ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
              ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                *)0xc6253d);
    std::
    get<0ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
              ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                *)0xc62553);
    bVar1 = ParamIterator<BLOCK_SIZE>::operator==
                      ((ParamIterator<BLOCK_SIZE> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    puVar5 = &stack0xffffffffffffffc4;
    local_81 = false;
    if (bVar1) {
      std::
      get<1ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                  *)0xc625ac);
      std::
      get<1ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                  *)0xc625c2);
      local_81 = ParamIterator<int>::operator==
                           ((ParamIterator<int> *)
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (ParamIterator<int> *)in_stack_ffffffffffffff58);
    }
    uVar7 = (uint)local_81 << 0x18;
    *puVar5 = local_81;
    other_00 = (ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                *)&stack0xffffffffffffffc5;
    uVar6 = false;
    if ((uVar7 & 0x1000000) != 0) {
      std::
      get<2ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                  *)0xc6261c);
      std::
      get<2ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                  *)0xc62632);
      uVar6 = ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
              ::operator==((ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                            *)CONCAT17(uVar6,in_stack_ffffffffffffff60),other_00);
    }
    *(undefined1 *)
     &(other_00->impl_)._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_*,_std::default_delete<testing::internal::ParamIteratorInterface<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_*,_false>
      ._M_head_impl = uVar6;
    puVar5 = &stack0xffffffffffffffc6;
    local_b1 = false;
    if ((bool)uVar6 != false) {
      std::
      get<3ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                  *)0xc6268c);
      std::
      get<3ul,testing::internal::ParamIterator<BLOCK_SIZE>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>,testing::internal::ParamIterator<void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>>
                ((tuple<testing::internal::ParamIterator<BLOCK_SIZE>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
                  *)0xc626a1);
      local_b1 = ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                 ::operator==((ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                               *)CONCAT17(uVar6,in_stack_ffffffffffffff60),other_00);
    }
    *puVar5 = local_b1;
    local_1 = local_b1;
  }
  return local_1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }